

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::load_op_is_supported(Impl *this,VkAttachmentLoadOp load_op)

{
  size_type sVar1;
  size_type sVar2;
  bool local_79;
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [36];
  VkAttachmentLoadOp local_1c;
  Impl *pIStack_18;
  VkAttachmentLoadOp load_op_local;
  Impl *this_local;
  
  if (load_op < (VK_ATTACHMENT_LOAD_OP_DONT_CARE|VK_ATTACHMENT_LOAD_OP_CLEAR)) {
    this_local._7_1_ = 1;
  }
  else if (load_op == VK_ATTACHMENT_LOAD_OP_NONE) {
    local_1c = load_op;
    pIStack_18 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"VK_KHR_load_store_op_none",&local_41);
    sVar1 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->enabled_extensions,(key_type *)local_40);
    local_79 = true;
    if (sVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"VK_EXT_load_store_op_none",&local_69);
      sVar2 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_68);
      local_79 = sVar2 != 0;
    }
    this_local._7_1_ = local_79;
    if (sVar1 == 0) {
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FeatureFilter::Impl::load_op_is_supported(VkAttachmentLoadOp load_op) const
{
	switch (load_op)
	{
	case VK_ATTACHMENT_LOAD_OP_CLEAR:
	case VK_ATTACHMENT_LOAD_OP_LOAD:
	case VK_ATTACHMENT_LOAD_OP_DONT_CARE:
		return true;
	case VK_ATTACHMENT_LOAD_OP_NONE_KHR:
		return enabled_extensions.count(VK_KHR_LOAD_STORE_OP_NONE_EXTENSION_NAME) != 0 ||
		       enabled_extensions.count(VK_EXT_LOAD_STORE_OP_NONE_EXTENSION_NAME) != 0;
	default:
		return false;
	}
}